

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O1

int fe_write_frame(fe_t *fe,mfcc_t *feat)

{
  double *pdVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  double *pdVar6;
  frame_t *pfVar7;
  frame_t *pfVar8;
  powspec_t *ppVar9;
  melfb_t *pmVar10;
  powspec_t *ppVar11;
  int16 *piVar12;
  int16 *piVar13;
  int16 *piVar14;
  mfcc_t *pmVar15;
  uint uVar16;
  powspec_t *spec;
  byte bVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  double *pdVar23;
  int iVar24;
  long lVar25;
  double *pdVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  
  pdVar6 = (double *)fe->frame;
  bVar2 = fe->fft_order;
  sVar3 = fe->fft_size;
  uVar20 = (uint)sVar3;
  uVar21 = (ulong)(int)uVar20;
  if (1 < (int)uVar20) {
    uVar19 = 0;
    iVar27 = 0;
    do {
      lVar25 = (long)iVar27;
      uVar29 = uVar20;
      if ((long)uVar19 < lVar25) {
        dVar32 = pdVar6[lVar25];
        pdVar6[lVar25] = pdVar6[uVar19];
        pdVar6[uVar19] = dVar32;
      }
      do {
        iVar22 = iVar27;
        uVar29 = (int)uVar29 / 2;
        iVar27 = iVar22 - uVar29;
      } while ((int)uVar29 <= iVar22);
      iVar27 = iVar22 + uVar29;
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar20 - 1);
  }
  if (0 < sVar3) {
    uVar19 = 0;
    do {
      dVar32 = pdVar6[uVar19];
      pdVar6[uVar19] = dVar32 + pdVar6[uVar19 + 1];
      pdVar6[uVar19 + 1] = dVar32 - pdVar6[uVar19 + 1];
      uVar19 = uVar19 + 2;
    } while (uVar19 < uVar21);
  }
  if (1 < bVar2) {
    uVar29 = 1;
    do {
      uVar16 = uVar29 + 1;
      if (0 < sVar3) {
        bVar17 = (byte)uVar29;
        iVar22 = 1 << (bVar17 & 0x1f);
        uVar29 = 1 << (bVar17 - 1 & 0x1f);
        iVar24 = 2 << (bVar17 & 0x1f);
        lVar25 = (long)iVar24;
        pdVar26 = pdVar6 + iVar22;
        iVar27 = iVar22 * 2 + -1;
        lVar28 = 0;
        pdVar23 = pdVar6;
        do {
          dVar32 = pdVar6[lVar28];
          pdVar1 = pdVar6 + iVar22 + lVar28;
          dVar33 = *pdVar1;
          pdVar6[lVar28] = dVar32 + dVar33;
          *pdVar1 = dVar32 - dVar33;
          pdVar1[(int)uVar29] = -pdVar1[(int)uVar29];
          if (1 < (int)uVar29) {
            pfVar7 = fe->ccc;
            pfVar8 = fe->sss;
            uVar19 = 1;
            lVar30 = 0;
            do {
              iVar31 = (int)uVar19 << (bVar2 - (char)uVar16 & 0x1f);
              iVar18 = iVar27 + (int)lVar30;
              dVar34 = pdVar26[uVar19] * (double)pfVar7[iVar31] +
                       (double)pfVar8[iVar31] * pdVar6[iVar18];
              dVar33 = pdVar26[uVar19] * (double)pfVar8[iVar31] -
                       (double)pfVar7[iVar31] * pdVar6[iVar18];
              dVar32 = pdVar26[lVar30 + -1];
              pdVar6[iVar18] = dVar32 - dVar33;
              pdVar26[uVar19] = -dVar32 - dVar33;
              pdVar26[lVar30 + -1] = pdVar23[uVar19] - dVar34;
              pdVar23[uVar19] = dVar34 + pdVar23[uVar19];
              uVar19 = uVar19 + 1;
              lVar30 = lVar30 + -1;
            } while (uVar29 != uVar19);
          }
          lVar28 = lVar28 + lVar25;
          pdVar23 = pdVar23 + lVar25;
          pdVar26 = pdVar26 + lVar25;
          iVar27 = iVar27 + iVar24;
        } while (lVar28 < (long)uVar21);
      }
      uVar29 = uVar16;
    } while (bVar2 != uVar16);
  }
  ppVar9 = fe->spec;
  *ppVar9 = (powspec_t)(*pdVar6 * *pdVar6);
  if (1 < sVar3) {
    uVar19 = 1;
    if (1 < uVar20 >> 1) {
      uVar19 = (ulong)(uVar20 >> 1);
    }
    pdVar26 = pdVar6 + uVar21;
    uVar21 = 0;
    do {
      pdVar26 = pdVar26 + -1;
      ppVar9[uVar21 + 1] =
           (powspec_t)(pdVar6[uVar21 + 1] * pdVar6[uVar21 + 1] + *pdVar26 * *pdVar26);
      uVar21 = uVar21 + 1;
    } while (uVar19 != uVar21);
  }
  pmVar10 = fe->mel_fb;
  iVar27 = pmVar10->num_filters;
  if (0 < (long)iVar27) {
    ppVar11 = fe->mfspec;
    piVar12 = pmVar10->spec_start;
    piVar13 = pmVar10->filt_start;
    piVar14 = pmVar10->filt_width;
    lVar25 = 0;
    do {
      sVar3 = piVar12[lVar25];
      sVar4 = piVar13[lVar25];
      ppVar11[lVar25] = 0.0;
      sVar5 = piVar14[lVar25];
      if (0 < (long)sVar5) {
        pmVar15 = pmVar10->filt_coeffs;
        dVar32 = 0.0;
        lVar28 = 0;
        do {
          dVar32 = dVar32 + (double)(float)pmVar15[sVar4 + lVar28] * (double)ppVar9[sVar3 + lVar28];
          ppVar11[lVar25] = (powspec_t)dVar32;
          lVar28 = lVar28 + 1;
        } while (sVar5 != lVar28);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != iVar27);
  }
  fe_remove_noise(fe);
  ppVar9 = fe->mfspec;
  if (0 < fe->mel_fb->num_filters) {
    lVar25 = 0;
    do {
      dVar32 = log((double)ppVar9[lVar25] + 0.0001);
      ppVar9[lVar25] = (powspec_t)dVar32;
      lVar25 = lVar25 + 1;
    } while (lVar25 < fe->mel_fb->num_filters);
  }
  if (fe->log_spec == '\x02') {
    fe_dct2(fe,ppVar9,feat,0);
    fe_dct3(fe,feat,ppVar9);
    bVar2 = fe->feature_dimension;
    if ((ulong)bVar2 != 0) {
      uVar21 = 0;
      do {
        feat[uVar21] = (mfcc_t)(float)(double)ppVar9[uVar21];
        uVar21 = uVar21 + 1;
      } while (bVar2 != uVar21);
    }
  }
  else if (fe->log_spec == '\x01') {
    bVar2 = fe->feature_dimension;
    if ((ulong)bVar2 != 0) {
      uVar21 = 0;
      do {
        feat[uVar21] = (mfcc_t)(float)(double)ppVar9[uVar21];
        uVar21 = uVar21 + 1;
      } while (bVar2 != uVar21);
    }
  }
  else {
    if (fe->transform == '\x02') {
      iVar27 = 1;
    }
    else {
      if (fe->transform != '\x01') {
        fe_spec2cep(fe,ppVar9,feat);
        goto LAB_00144815;
      }
      iVar27 = 0;
    }
    fe_dct2(fe,ppVar9,feat,iVar27);
  }
LAB_00144815:
  if ((fe->mel_fb->lifter_val != 0) && (bVar2 = fe->num_cepstra, (ulong)bVar2 != 0)) {
    pmVar15 = fe->mel_fb->lifter;
    uVar21 = 0;
    do {
      feat[uVar21] = (mfcc_t)((float)feat[uVar21] * (float)pmVar15[uVar21]);
      uVar21 = uVar21 + 1;
    } while (bVar2 != uVar21);
  }
  return 1;
}

Assistant:

static int
fe_fft_real(fe_t *fe)
{
    int i, j, k, m, n;
    frame_t *x, xt;

    x = fe->frame;
    m = fe->fft_order;
    n = fe->fft_size;

    /* Bit-reverse the input. */
    j = 0;
    for (i = 0; i < n - 1; ++i) {
        if (i < j) {
            xt = x[j];
            x[j] = x[i];
            x[i] = xt;
        }
        k = n / 2;
        while (k <= j) {
            j -= k;
            k /= 2;
        }
        j += k;
    }

    /* Basic butterflies (2-point FFT, real twiddle factors):
     * x[i]   = x[i] +  1 * x[i+1]
     * x[i+1] = x[i] + -1 * x[i+1]
     */
    for (i = 0; i < n; i += 2) {
        xt = x[i];
        x[i] = (xt + x[i + 1]);
        x[i + 1] = (xt - x[i + 1]);
    }

    /* The rest of the butterflies, in stages from 1..m */
    for (k = 1; k < m; ++k) {
        int n1, n2, n4;

        n4 = k - 1;
        n2 = k;
        n1 = k + 1;
        /* Stride over each (1 << (k+1)) points */
        for (i = 0; i < n; i += (1 << n1)) {
            /* Basic butterfly with real twiddle factors:
             * x[i]          = x[i] +  1 * x[i + (1<<k)]
             * x[i + (1<<k)] = x[i] + -1 * x[i + (1<<k)]
             */
            xt = x[i];
            x[i] = (xt + x[i + (1 << n2)]);
            x[i + (1 << n2)] = (xt - x[i + (1 << n2)]);

            /* The other ones with real twiddle factors:
             * x[i + (1<<k) + (1<<(k-1))]
             *   = 0 * x[i + (1<<k-1)] + -1 * x[i + (1<<k) + (1<<k-1)]
             * x[i + (1<<(k-1))]
             *   = 1 * x[i + (1<<k-1)] +  0 * x[i + (1<<k) + (1<<k-1)]
             */
            x[i + (1 << n2) + (1 << n4)] = -x[i + (1 << n2) + (1 << n4)];
            x[i + (1 << n4)] = x[i + (1 << n4)];

            /* Butterflies with complex twiddle factors.
             * There are (1<<k-1) of them.
             */
            for (j = 1; j < (1 << n4); ++j) {
                frame_t cc, ss, t1, t2;
                int i1, i2, i3, i4;

                i1 = i + j;
                i2 = i + (1 << n2) - j;
                i3 = i + (1 << n2) + j;
                i4 = i + (1 << n2) + (1 << n2) - j;

                /*
                 * cc = real(W[j * n / (1<<(k+1))])
                 * ss = imag(W[j * n / (1<<(k+1))])
                 */
                cc = fe->ccc[j << (m - n1)];
                ss = fe->sss[j << (m - n1)];

                /* There are some symmetry properties which allow us
                 * to get away with only four multiplications here. */
                t1 = COSMUL(x[i3], cc) + COSMUL(x[i4], ss);
                t2 = COSMUL(x[i3], ss) - COSMUL(x[i4], cc);

                x[i4] = (x[i2] - t2);
                x[i3] = (-x[i2] - t2);
                x[i2] = (x[i1] - t1);
                x[i1] = (x[i1] + t1);
            }
        }
    }

    /* This isn't used, but return it for completeness. */
    return m;
}